

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O3

size_t __thiscall
jsoncons::jmespath::detail::
token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::precedence_level
          (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *this)

{
  token_kind tVar1;
  assertion_error *paVar2;
  expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *peVar3;
  string local_38;
  
  tVar1 = this->type_;
  if (tVar1 == expression) {
    peVar3 = (this->field_2).expression_;
    if (peVar3 == (expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)0x0) {
      paVar2 = (assertion_error *)__cxa_allocate_exception(0x10);
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"assertion \'expression_ != nullptr\' failed at  <> :0","");
      assertion_error::assertion_error(paVar2,&local_38);
      __cxa_throw(paVar2,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else if (tVar1 == binary_operator) {
    peVar3 = (this->field_2).expression_;
    if (peVar3 == (expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)0x0) {
      paVar2 = (assertion_error *)__cxa_allocate_exception(0x10);
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"assertion \'binary_operator_ != nullptr\' failed at  <> :0",""
                );
      assertion_error::assertion_error(paVar2,&local_38);
      __cxa_throw(paVar2,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    if (tVar1 != unary_operator) {
      return 0;
    }
    peVar3 = (this->field_2).expression_;
    if (peVar3 == (expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)0x0) {
      paVar2 = (assertion_error *)__cxa_allocate_exception(0x10);
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"assertion \'unary_operator_ != nullptr\' failed at  <> :0","")
      ;
      assertion_error::assertion_error(paVar2,&local_38);
      __cxa_throw(paVar2,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return peVar3->precedence_level_;
}

Assistant:

std::size_t precedence_level() const
        {
            switch(type_)
            {
                case token_kind::unary_operator:
                    JSONCONS_ASSERT(unary_operator_ != nullptr);
                    return unary_operator_->precedence_level();
                case token_kind::binary_operator:
                    JSONCONS_ASSERT(binary_operator_ != nullptr);
                    return binary_operator_->precedence_level();
                case token_kind::expression:
                    JSONCONS_ASSERT(expression_ != nullptr);
                    return expression_->precedence_level();
                default:
                    return 0;
            }
        }